

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O1

int csp_zmqhub_init_filter2
              (char *ifname,char *host,uint16_t addr,uint16_t netmask,int promisc,
              csp_iface_t **return_interface,char *sec_key,uint16_t subport,uint16_t pubport)

{
  ushort uVar1;
  uint uVar2;
  pthread_t *__newthread;
  pthread_t pVar3;
  ushort *puVar4;
  char *__src;
  ushort uVar5;
  long lVar6;
  ushort *puVar7;
  int intvl;
  int cnt;
  int idle;
  int keep_alive;
  char sub [100];
  char pub [100];
  pthread_attr_t attributes;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  char local_148 [112];
  char local_d8 [112];
  pthread_attr_t local_68;
  
  uVar2 = snprintf(local_d8,100,"tcp://%s:%u",host,(ulong)subport);
  if (99 < uVar2) {
    local_d8[0] = '\0';
  }
  uVar2 = snprintf(local_148,100,"tcp://%s:%u",host,(ulong)pubport);
  if (99 < uVar2) {
    local_148[0] = '\0';
  }
  __newthread = (pthread_t *)calloc(1,0x90);
  __src = "ZMQHUB";
  if (ifname != (char *)0x0) {
    __src = ifname;
  }
  strncpy((char *)(__newthread + 4),__src,10);
  __newthread[7] = (pthread_t)(__newthread + 4);
  __newthread[9] = (pthread_t)__newthread;
  __newthread[10] = (pthread_t)csp_zmqhub_tx;
  pVar3 = zmq_ctx_new();
  __newthread[1] = pVar3;
  csp_print_func("  ZMQ init %s: addr: %u, pub(tx): [%s], sub(rx): [%s]\n",__newthread[7],
                 (ulong)addr,local_d8,local_148);
  pVar3 = zmq_socket(__newthread[1],1);
  __newthread[2] = pVar3;
  pVar3 = zmq_socket(__newthread[1],2);
  __newthread[3] = pVar3;
  if (sec_key != (char *)0x0) {
    zmq_curve_public(&local_68,sec_key);
    zmq_setsockopt(__newthread[2],0x32,&local_68,0x29);
    zmq_setsockopt(__newthread[2],0x30,&local_68,0x29);
    zmq_setsockopt(__newthread[2],0x31,sec_key,0x29);
    zmq_setsockopt(__newthread[3],0x32,&local_68,0x29);
    zmq_setsockopt(__newthread[3],0x30,&local_68,0x29);
    zmq_setsockopt(__newthread[3],0x31,sec_key,0x29);
  }
  local_14c = 1;
  local_150 = 900;
  local_154 = 2;
  local_158 = 900;
  zmq_setsockopt(__newthread[2],0x22,&local_14c,4);
  zmq_setsockopt(__newthread[2],0x24,&local_150,4);
  zmq_setsockopt(__newthread[2],0x23,&local_154,4);
  zmq_setsockopt(__newthread[2],0x25,&local_158,4);
  zmq_setsockopt(__newthread[3],0x22,&local_14c,4);
  zmq_setsockopt(__newthread[3],0x24,&local_150,4);
  zmq_setsockopt(__newthread[3],0x23,&local_154,4);
  zmq_setsockopt(__newthread[3],0x25,&local_158,4);
  uVar2 = csp_id_get_host_bits();
  zmq_connect(__newthread[2],local_d8);
  zmq_connect(__newthread[3],local_148);
  if (promisc == 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      puVar4 = (ushort *)((long)csp_zmqhub_init_filter2::filt[0] + lVar6 + 2);
      uVar1 = uVar5 | addr | ~(ushort)(-1 << ((char)uVar2 - (char)netmask & 0x1fU));
      *(uint16_t *)((long)csp_zmqhub_init_filter2::filt[0] + lVar6) =
           addr << 8 | (uVar5 | addr) >> 8;
      *puVar4 = uVar1 << 8 | uVar1 >> 8;
      puVar7 = (ushort *)((long)csp_zmqhub_init_filter2::filt[0] + lVar6 + 4);
      *puVar7 = (ushort)(uVar5 + 0x3fff) >> 8 | 0xff00;
      zmq_setsockopt(__newthread[3],6,(long)csp_zmqhub_init_filter2::filt[0] + lVar6,2);
      zmq_setsockopt(__newthread[3],6,puVar4,2);
      zmq_setsockopt(__newthread[3],6,puVar7,2);
      uVar5 = uVar5 + 0x4000;
      lVar6 = lVar6 + 6;
    } while (lVar6 != 0x18);
  }
  else {
    zmq_setsockopt(__newthread[3],6,0,0);
  }
  pthread_attr_init(&local_68);
  pthread_attr_setdetachstate(&local_68,1);
  pthread_create(__newthread,&local_68,csp_zmqhub_task,__newthread);
  csp_iflist_add((csp_iface_t *)(__newthread + 6));
  if (return_interface != (csp_iface_t **)0x0) {
    *return_interface = (csp_iface_t *)(__newthread + 6);
  }
  return 0;
}

Assistant:

int csp_zmqhub_init_filter2(const char * ifname, const char * host, uint16_t addr, uint16_t netmask, int promisc, csp_iface_t ** return_interface, char * sec_key, uint16_t subport, uint16_t pubport) {
	
	char pub[100];
	csp_zmqhub_make_endpoint(host, subport, pub, sizeof(pub));

	char sub[100];
	csp_zmqhub_make_endpoint(host, pubport, sub, sizeof(sub));

	int ret;
	pthread_attr_t attributes;
	zmq_driver_t * drv = calloc(1, sizeof(*drv));
	assert(drv != NULL);

	if (ifname == NULL) {
		ifname = CSP_ZMQHUB_IF_NAME;
	}

	strncpy(drv->name, ifname, sizeof(drv->name) - 1);
	drv->iface.name = drv->name;
	drv->iface.driver_data = drv;
	drv->iface.nexthop = csp_zmqhub_tx;

	drv->context = zmq_ctx_new();
	assert(drv->context != NULL);

	csp_print("  ZMQ init %s: addr: %u, pub(tx): [%s], sub(rx): [%s]\n", drv->iface.name, addr, pub, sub);

	/* Publisher (TX) */
	drv->publisher = zmq_socket(drv->context, ZMQ_PUB);
	assert(drv->publisher != NULL);

	/* Subscriber (RX) */
	drv->subscriber = zmq_socket(drv->context, ZMQ_SUB);
	assert(drv->subscriber != NULL);

	/* If shared secret key provided */
	if (sec_key) {
		char pub_key[41];

		zmq_curve_public(pub_key, sec_key);
		/* Publisher (TX) */
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_SERVERKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_PUBLICKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_SECRETKEY, sec_key, CURVE_KEYLEN);
		/* Subscriber (RX) */
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_SERVERKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_PUBLICKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_SECRETKEY, sec_key, CURVE_KEYLEN);
	}
	int keep_alive = 1;
	/* Time in seconds a connection must be idle before keep-alive packet send*/
	int idle = 900;
	/* Maximum number of keep-alive probes to send without ack before connection closed */
	int cnt = 2;
	/* Interval in seconds between each keep-alive probe */
	int intvl = 900;
	/* Publisher (TX) */
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE, &keep_alive, sizeof(keep_alive));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_IDLE, &idle, sizeof(idle));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_CNT, &cnt, sizeof(cnt));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_INTVL, &intvl, sizeof(intvl));
	/* Subscriber (RX) */
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE, &keep_alive, sizeof(keep_alive));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_IDLE, &idle, sizeof(idle));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_CNT, &cnt, sizeof(cnt));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_INTVL, &intvl, sizeof(intvl));

	/* Generate filters */
	uint16_t hostmask = (1 << (csp_id_get_host_bits() - netmask)) - 1;
	
	/* Connect to server */
	ret = zmq_connect(drv->publisher, pub);
	assert(ret == 0);
	ret = zmq_connect(drv->subscriber, sub);
	assert(ret == 0);
	(void)ret;

	if (promisc) {

		// subscribe to all packets - no filter
		ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, NULL, 0);
		assert(ret == 0);

	} else {

		/* This needs to be static, because ZMQ does not copy the filter value to the
		 * outgoing packet for each setsockopt call */
		static uint16_t filt[4][3];

		for (int i = 0; i < 4; i++) {
			//int i = CSP_PRIO_NORM;
			filt[i][0] = __builtin_bswap16((i << 14) | addr);
			filt[i][1] = __builtin_bswap16((i << 14) | addr | hostmask);
			filt[i][2] = __builtin_bswap16((i << 14) | 16383);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][0], 2);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][1], 2);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][2], 2);
		}

	} 


	/* Start RX thread */
	ret = pthread_attr_init(&attributes);
	assert(ret == 0);
	ret = pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
	assert(ret == 0);
	ret = pthread_create(&drv->rx_thread, &attributes, csp_zmqhub_task, drv);
	assert(ret == 0);

	/* Register interface */
	csp_iflist_add(&drv->iface);

	if (return_interface) {
		*return_interface = &drv->iface;
	}

	return CSP_ERR_NONE;
}